

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerVariablesHelper.cxx
# Opt level: O3

shared_ptr<cmDebugger::cmDebuggerVariables> __thiscall
cmDebugger::cmDebuggerVariablesHelper::CreateIfAny
          (cmDebuggerVariablesHelper *this,
          shared_ptr<cmDebugger::cmDebuggerVariablesManager> *variablesManager,string *name,
          bool supportsVariableType,cmMakefile *mf)

{
  cmDebuggerVariables *this_00;
  pointer pcVar1;
  undefined8 *puVar2;
  string *extraout_RDX;
  string *extraout_RDX_00;
  shared_ptr<cmDebugger::cmDebuggerVariables> sVar3;
  string local_80;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  shared_ptr<cmDebugger::cmDebuggerVariablesManager> local_40;
  
  if (mf == (cmMakefile *)0x0) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    *(undefined8 *)this = 0;
    puVar2 = (undefined8 *)operator_new(0xb0);
    local_40.super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (variablesManager->
             super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>)
             ._M_ptr;
    local_40.super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (variablesManager->
         super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    puVar2[1] = 0x100000001;
    *puVar2 = &PTR___Sp_counted_ptr_inplace_00a8ce78;
    if (local_40.
        super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_40.
         super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_40.
              super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_40.
         super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_40.
              super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    pcVar1 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar1,pcVar1 + name->_M_string_length);
    this_00 = (cmDebuggerVariables *)(puVar2 + 2);
    local_48 = std::
               _Function_handler<std::vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmDebuggerVariablesHelper.cxx:544:51)>
               ::_M_invoke;
    local_50 = std::
               _Function_handler<std::vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmDebuggerVariablesHelper.cxx:544:51)>
               ::_M_manager;
    local_60._M_unused._M_object = mf;
    cmDebuggerVariables::cmDebuggerVariables
              (this_00,&local_40,&local_80,supportsVariableType,
               (function<std::vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>_()>
                *)&local_60);
    if (local_50 != (code *)0x0) {
      (*local_50)(&local_60,&local_60,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if (local_40.
        super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.
                 super___shared_ptr<cmDebugger::cmDebuggerVariablesManager,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    *(undefined8 **)(this + 8) = puVar2;
    *(cmDebuggerVariables **)this = this_00;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"ListFiles","");
    CreateIfAny((cmDebuggerVariablesHelper *)local_60._M_pod_data,variablesManager,&local_80,
                supportsVariableType,&mf->ListFiles);
    cmDebuggerVariables::AddSubVariables
              (this_00,(shared_ptr<cmDebugger::cmDebuggerVariables> *)&local_60);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"OutputFiles","");
    CreateIfAny((cmDebuggerVariablesHelper *)local_60._M_pod_data,variablesManager,&local_80,
                supportsVariableType,&mf->OutputFiles);
    cmDebuggerVariables::AddSubVariables
              (this_00,(shared_ptr<cmDebugger::cmDebuggerVariables> *)&local_60);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    *(undefined1 *)(puVar2 + 0x13) = 1;
    cmMakefile::GetDirectoryId((cmDirectoryId *)&local_80,mf);
    std::__cxx11::string::_M_assign((string *)(puVar2 + 8));
    name = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      name = extraout_RDX_00;
    }
  }
  sVar3.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name;
  sVar3.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cmDebugger::cmDebuggerVariables>)
         sVar3.super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<cmDebuggerVariables> cmDebuggerVariablesHelper::CreateIfAny(
  std::shared_ptr<cmDebuggerVariablesManager> const& variablesManager,
  std::string const& name, bool supportsVariableType, cmMakefile* mf)
{
  if (mf == nullptr) {
    return {};
  }

  auto AppleSDKTypeString = [&](cmMakefile::AppleSDK sdk) {
    switch (sdk) {
      case cmMakefile::AppleSDK::MacOS:
        return "MacOS";
      case cmMakefile::AppleSDK::IPhoneOS:
        return "IPhoneOS";
      case cmMakefile::AppleSDK::IPhoneSimulator:
        return "IPhoneSimulator";
      case cmMakefile::AppleSDK::AppleTVOS:
        return "AppleTVOS";
      case cmMakefile::AppleSDK::AppleTVSimulator:
        return "AppleTVSimulator";
      default:
        return "Unknown";
    }
  };

  auto variables = std::make_shared<cmDebuggerVariables>(
    variablesManager, name, supportsVariableType, [=]() {
      std::vector<cmDebuggerVariableEntry> ret = {
        { "DefineFlags", mf->GetDefineFlags() },
        { "DirectoryId", mf->GetDirectoryId().String },
        { "IsRootMakefile", mf->IsRootMakefile() },
        { "HomeDirectory", mf->GetHomeDirectory() },
        { "HomeOutputDirectory", mf->GetHomeOutputDirectory() },
        { "CurrentSourceDirectory", mf->GetCurrentSourceDirectory() },
        { "CurrentBinaryDirectory", mf->GetCurrentBinaryDirectory() },
        { "PlatformIs32Bit", mf->PlatformIs32Bit() },
        { "PlatformIs64Bit", mf->PlatformIs64Bit() },
        { "PlatformIsx32", mf->PlatformIsx32() },
        { "AppleSDKType", AppleSDKTypeString(mf->GetAppleSDKType()) },
        { "PlatformIsAppleEmbedded", mf->PlatformIsAppleEmbedded() }
      };

      return ret;
    });

  variables->AddSubVariables(CreateIfAny(
    variablesManager, "ListFiles", supportsVariableType, mf->GetListFiles()));
  variables->AddSubVariables(CreateIfAny(variablesManager, "OutputFiles",
                                         supportsVariableType,
                                         mf->GetOutputFiles()));

  variables->SetIgnoreEmptyStringEntries(true);
  variables->SetValue(mf->GetDirectoryId().String);
  return variables;
}